

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseCodeMetadataAnnotation(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  size_t sVar2;
  char *pcVar3;
  Result RVar4;
  Expr *pEVar5;
  ExprList *pEVar6;
  Enum EVar7;
  string data_text;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Token tk;
  string local_a8;
  Expr *local_88;
  size_t sStack_80;
  char *local_78;
  Token local_70;
  
  Consume(&local_70,this);
  if (5 < local_70.token_type_ - AlignEqNat) {
    __assert_fail("HasText()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                  ,99,"std::string_view wabt::Token::text() const");
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  RVar4 = ParseQuotedText(this,&local_a8,false);
  EVar7 = Error;
  if (RVar4.enum_ != Error) {
    local_88 = (Expr *)0x0;
    sStack_80 = 0;
    local_78 = (char *)0x0;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
               local_a8._M_dataplus._M_p,local_a8._M_dataplus._M_p + local_a8._M_string_length);
    pEVar5 = (Expr *)operator_new(0x68);
    pcVar3 = local_78;
    sVar2 = sStack_80;
    pEVar1 = local_88;
    local_78 = (char *)0x0;
    local_88 = (Expr *)0x0;
    sStack_80 = 0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar5->loc).filename._M_len = 0;
    (pEVar5->loc).filename._M_str = (char *)0x0;
    *(undefined8 *)((long)&(pEVar5->loc).filename._M_str + 4) = 0;
    *(undefined8 *)((long)&(pEVar5->loc).field_1.field_1.offset + 4) = 0;
    pEVar5->type_ = CodeMetadata;
    pEVar5->_vptr_Expr = (_func_int **)&PTR__CodeMetadataExpr_001a76b8;
    pEVar5[1]._vptr_Expr = (_func_int **)(local_70.field_2.text_._M_len - 0xe);
    pEVar5[1].super_intrusive_list_base<wabt::Expr>.next_ =
         (Expr *)(local_70.field_2.literal_.text._M_len + 0xe);
    pEVar5[1].super_intrusive_list_base<wabt::Expr>.prev_ = pEVar1;
    pEVar5[1].loc.filename._M_len = sVar2;
    pEVar5[1].loc.filename._M_str = pcVar3;
    if (((pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
       ((pEVar5->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                    ,0x1bd,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar1 = exprs->last_;
    pEVar6 = exprs;
    if (pEVar1 != (Expr *)0x0) {
      (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
      pEVar6 = (ExprList *)&pEVar1->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar6->first_ = pEVar5;
    exprs->last_ = pEVar5;
    exprs->size_ = exprs->size_ + 1;
    RVar4 = Expect(this,Rpar);
    if (local_88 != (Expr *)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
    EVar7 = (Enum)(RVar4.enum_ == Error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar7;
}

Assistant:

Result WastParser::ParseCodeMetadataAnnotation(ExprList* exprs) {
  WABT_TRACE(ParseCodeMetadataAnnotation);
  Token tk = Consume();
  std::string_view name = tk.text();
  name.remove_prefix(sizeof("metadata.code.") - 1);
  std::string data_text;
  CHECK_RESULT(ParseQuotedText(&data_text, false));
  std::vector<uint8_t> data(data_text.begin(), data_text.end());
  exprs->push_back(std::make_unique<CodeMetadataExpr>(name, std::move(data)));
  EXPECT(Rpar);
  return Result::Ok;
}